

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecmanager.cxx
# Opt level: O3

string * __thiscall
vigra::CodecManager::getFileTypeByMagicString
          (string *__return_storage_ptr__,CodecManager *this,string *filename)

{
  pointer ppVar1;
  pointer pcVar2;
  char *message;
  int iVar3;
  pointer ppVar4;
  ContractViolation *this_00;
  size_t __n;
  size_type *psVar5;
  char fmagic [4];
  string msg;
  ifstream stream;
  undefined1 local_24c [4];
  char *local_248 [2];
  char local_238 [16];
  long local_228 [4];
  int aiStack_208 [122];
  
  std::ifstream::ifstream(local_228,(filename->_M_dataplus)._M_p,_S_in);
  if (*(int *)((long)aiStack_208 + *(long *)(local_228[0] + -0x18)) != 0) {
    local_248[0] = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Unable to open file \'","")
    ;
    std::__cxx11::string::_M_append((char *)local_248,(ulong)(filename->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)local_248);
    message = local_248[0];
    this_00 = (ContractViolation *)__cxa_allocate_exception(0x28);
    ContractViolation::ContractViolation
              (this_00,"Precondition violation!",message,
               "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/codecmanager.cxx"
               ,0xcb);
    *(undefined ***)this_00 = &PTR__ContractViolation_0015ba28;
    __cxa_throw(this_00,&PreconditionViolation::typeinfo,ContractViolation::~ContractViolation);
  }
  std::istream::read((char *)local_228,(long)local_24c);
  std::ifstream::close();
  ppVar4 = (this->magicStrings).
           super__Vector_base<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->magicStrings).
           super__Vector_base<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 < ppVar1) {
    psVar5 = &(ppVar4->second)._M_string_length;
    do {
      __n = psVar5[-3] - (long)psVar5[-4];
      if (__n == 0) {
LAB_00127ab7:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar2 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (psVar5 + -1))->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar2,pcVar2 + *psVar5);
        goto LAB_00127ad0;
      }
      iVar3 = bcmp((void *)psVar5[-4],local_24c,__n);
      if (iVar3 == 0) goto LAB_00127ab7;
      ppVar4 = (pointer)(psVar5 + 3);
      psVar5 = psVar5 + 7;
    } while (ppVar4 < ppVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00127ad0:
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

std::string
    CodecManager::getFileTypeByMagicString( const std::string & filename )
        const
    {
        // support for reading the magic string from stdin has been dropped
        // it was not guaranteed to work by the Standard

        // get the magic string
        const unsigned int magiclen = 4;
        char fmagic[magiclen];
#ifdef VIGRA_NEED_BIN_STREAMS
        std::ifstream stream(filename.c_str(), std::ios::binary);
#else
        std::ifstream stream(filename.c_str());
#endif
        if(!stream.good())
        {
            std::string msg("Unable to open file '");
            msg += filename;
            msg += "'.";
            vigra_precondition(0, msg.c_str());
        }
        stream.read( fmagic, magiclen );
        stream.close();

        // compare with the known magic strings
        typedef std::vector< std::pair< std::vector<char>, std::string > >
            magic_type;
        for( magic_type::const_iterator iter = magicStrings.begin();
             iter < magicStrings.end(); ++iter ) {
            const std::vector<char> & magic = iter->first;
            if ( std::equal( magic.begin(), magic.end(), fmagic ) )
                return iter->second;
        }

        // did not find a matching string
        return std::string();
    }